

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.hpp
# Opt level: O0

API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
* __thiscall
Args::details::
API<Args::CmdLine,Args::CmdLine,std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,true>
::addOnlyOneGroup<char_const(&)[2]>
          (API<Args::CmdLine,_Args::CmdLine,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_true>
           *this,char (*name) [2],bool required)

{
  byte in_CL;
  CmdLine *in_RSI;
  API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  *in_RDI;
  ArgPtr *in_stack_00000028;
  CmdLine *in_stack_00000030;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> a;
  OnlyOneGroup *g;
  unique_ptr<Args::OnlyOneGroup,_Args::details::Deleter<Args::ArgIface>_> group;
  pointer in_stack_ffffffffffffff48;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *puVar1;
  unique_ptr<Args::OnlyOneGroup,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff50
  ;
  CmdLine *this_00;
  unique_ptr<Args::OnlyOneGroup,_Args::details::Deleter<Args::ArgIface>_> *in_stack_ffffffffffffff58
  ;
  OnlyOneGroup *in_stack_ffffffffffffff60;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *this_01;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_58;
  type local_48;
  unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> local_3d [2];
  byte local_19;
  
  local_19 = in_CL & 1;
  operator_new(0x50);
  OnlyOneGroup::OnlyOneGroup<char_const(&)[2]>
            (in_stack_ffffffffffffff60,(char (*) [2])in_stack_ffffffffffffff58,
             SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0));
  this_01 = local_3d;
  Deleter<Args::ArgIface>::Deleter((Deleter<Args::ArgIface> *)this_01,true);
  std::unique_ptr<Args::OnlyOneGroup,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::details::Deleter<Args::ArgIface>,void>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (__enable_if_t<_is_lvalue_reference<Deleter<ArgIface>_>::value,_Args::details::Deleter<Args::ArgIface>_&&>
              )0x15a7a3);
  local_48 = std::unique_ptr<Args::OnlyOneGroup,_Args::details::Deleter<Args::ArgIface>_>::operator*
                       (in_stack_ffffffffffffff50);
  puVar1 = &local_58;
  std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>::
  unique_ptr<Args::OnlyOneGroup,Args::details::Deleter<Args::ArgIface>,void>
            (this_01,in_stack_ffffffffffffff58);
  this_00 = (in_RSI->super_CmdLineAPI<CmdLine,_CmdLine,_ArgPtrToAPI>).m_self;
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00,puVar1);
  CmdLine::addArg(in_stack_00000030,in_stack_00000028);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  API<Args::CmdLine,_Args::OnlyOneGroup,_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_false>
  ::API(in_RDI,in_RSI,local_48);
  std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  std::unique_ptr<Args::OnlyOneGroup,_Args::details::Deleter<Args::ArgIface>_>::~unique_ptr
            ((unique_ptr<Args::OnlyOneGroup,_Args::details::Deleter<Args::ArgIface>_> *)this_00);
  return in_RDI;
}

Assistant:

API< PARENT, OnlyOneGroup, ARGPTR, false > addOnlyOneGroup(
		//! Name of the group.
		NAME && name,
		//! Is group required?
		bool required = false )
	{
		auto group = std::unique_ptr< OnlyOneGroup, details::Deleter< ArgIface > > (
			new OnlyOneGroup( std::forward< NAME > ( name ), required ),
			details::Deleter< ArgIface > ( true ) );

		OnlyOneGroup & g = *group;

		ARGPTR a = std::move( group );

		m_self.addArg( std::move( a ) );

		return API< PARENT, OnlyOneGroup, ARGPTR, false >
			( *( static_cast< PARENT* > ( this ) ), g );
	}